

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void secp256k1_bulletproof_serialize_points(uchar *out,secp256k1_ge *pt,size_t n)

{
  int iVar1;
  ulong uVar2;
  uchar *r_00;
  secp256k1_fe *a;
  secp256k1_fe pointx;
  secp256k1_fe r;
  secp256k1_fe local_88;
  secp256k1_fe local_58;
  
  uVar2 = n + 7 >> 3;
  memset(out,0,uVar2);
  if (n != 0) {
    r_00 = out + uVar2;
    a = &pt->y;
    uVar2 = 0;
    do {
      local_88.n[4] = (((secp256k1_ge *)(a + -1))->x).n[4];
      local_88.n[0] = (((secp256k1_ge *)(a + -1))->x).n[0];
      local_88.n[1] = (((secp256k1_ge *)(a + -1))->x).n[1];
      local_88.n[2] = (((secp256k1_ge *)(a + -1))->x).n[2];
      local_88.n[3] = (((secp256k1_ge *)(a + -1))->x).n[3];
      secp256k1_fe_normalize(&local_88);
      secp256k1_fe_get_b32(r_00,&local_88);
      iVar1 = secp256k1_fe_sqrt(&local_58,a);
      if (iVar1 == 0) {
        out[uVar2 >> 3] = out[uVar2 >> 3] | (byte)(1L << ((byte)uVar2 & 7));
      }
      uVar2 = uVar2 + 1;
      a = (secp256k1_fe *)((long)(a + 2) + 8);
      r_00 = r_00 + 0x20;
    } while (n != uVar2);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_bulletproof_serialize_points(unsigned char *out, secp256k1_ge *pt, size_t n) {
    const size_t bitveclen = (n + 7) / 8;
    size_t i;

    memset(out, 0, bitveclen);
    for (i = 0; i < n; i++) {
        secp256k1_fe pointx;
        pointx = pt[i].x;
        secp256k1_fe_normalize(&pointx);
        secp256k1_fe_get_b32(&out[bitveclen + i*32], &pointx);
        if (!secp256k1_fe_is_quad_var(&pt[i].y)) {
            out[i/8] |= (1ull << (i % 8));
        }
    }
}